

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetInterpolantDegree(void *arkode_mem,int degree)

{
  undefined4 in_ESI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetInterpolantDegree",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode","arkSetInterpolantDegree",
                    "Interpolation module is not yet allocated");
    local_4 = -0x15;
  }
  else if (in_RDI->initialized == 0) {
    local_4 = arkInterpSetDegree((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                 (ARKInterp)in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    arkProcessError(in_RDI,-0x28,"ARKode","arkSetInterpolantType",
                    "Degree cannot be specified after module initialization.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkSetInterpolantDegree(void *arkode_mem, int degree)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetInterpolantDegree", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkSetInterpolantDegree",
                    "Interpolation module is not yet allocated");
    return(ARK_MEM_NULL);
  }

  /* do not change degree once the module has been initialized */
  if (ark_mem->initialized) {
    arkProcessError(ark_mem, ARK_INTERP_FAIL, "ARKode",
                    "arkSetInterpolantType",
                    "Degree cannot be specified after module initialization.");
    return(ARK_ILL_INPUT);
  }

  /* pass 'degree' to interpolation module, returning its value */
  return(arkInterpSetDegree(ark_mem, ark_mem->interp, degree));
}